

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_braid_c.c
# Opt level: O1

uint32_t crc32_braid(uint32_t crc,uint8_t *buf,size_t len)

{
  byte *pbVar1;
  uint8_t *puVar2;
  ulong uVar3;
  byte bVar4;
  ulong *puVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  
  uVar12 = ~crc;
  uVar16 = (ulong)uVar12;
  if (0x2e < len) {
    if (((ulong)buf & 7) != 0) {
      puVar2 = buf + 1;
      sVar7 = len;
      do {
        len = sVar7 - 1;
        uVar3 = *(ulong *)buf;
        buf = (uint8_t *)((long)buf + 1);
        uVar12 = (uint)(uVar16 >> 8) ^ crc_table[(byte)((byte)uVar3 ^ (byte)uVar16)];
        uVar16 = (ulong)uVar12;
        if (sVar7 == 1) break;
        uVar3 = (ulong)puVar2 & 7;
        puVar2 = puVar2 + 1;
        sVar7 = len;
      } while (uVar3 != 0);
    }
    uVar16 = (ulong)uVar12;
    lVar10 = len / 0x28 - 1;
    if (lVar10 == 0) {
      uVar18 = 0;
      uVar13 = 0;
      uVar6 = 0;
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      uVar6 = 0;
      uVar13 = 0;
      uVar18 = 0;
      puVar5 = (ulong *)buf;
      do {
        uVar15 = uVar16 ^ *puVar5;
        uVar11 = uVar18 ^ puVar5[1];
        uVar17 = uVar13 ^ puVar5[2];
        uVar14 = uVar6 ^ puVar5[3];
        uVar8 = uVar3 ^ puVar5[4];
        uVar16 = (ulong)crc_braid_table[0][(uint)uVar15 & 0xff];
        uVar18 = (ulong)crc_braid_table[0][(uint)uVar11 & 0xff];
        uVar13 = (ulong)crc_braid_table[0][(uint)uVar17 & 0xff];
        uVar6 = (ulong)crc_braid_table[0][(uint)uVar14 & 0xff];
        uVar3 = (ulong)crc_braid_table[0][(uint)uVar8 & 0xff];
        bVar4 = 8;
        lVar19 = 0;
        do {
          uVar16 = uVar16 ^ *(uint *)(lVar19 + (ulong)((uint)(uVar15 >> (bVar4 & 0x3f)) & 0xff) * 4
                                               + 0x136290);
          uVar18 = uVar18 ^ *(uint *)(lVar19 + (ulong)((uint)(uVar11 >> (bVar4 & 0x3f)) & 0xff) * 4
                                               + 0x136290);
          uVar13 = uVar13 ^ *(uint *)(lVar19 + (ulong)((uint)(uVar17 >> (bVar4 & 0x3f)) & 0xff) * 4
                                               + 0x136290);
          uVar6 = uVar6 ^ *(uint *)(lVar19 + (ulong)((uint)(uVar14 >> (bVar4 & 0x3f)) & 0xff) * 4 +
                                             0x136290);
          uVar3 = uVar3 ^ *(uint *)(lVar19 + (ulong)((uint)(uVar8 >> (bVar4 & 0x3f)) & 0xff) * 4 +
                                             0x136290);
          bVar4 = bVar4 + 8;
          lVar19 = lVar19 + 0x400;
        } while (lVar19 != 0x1c00);
        puVar5 = puVar5 + 5;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      buf = (uint8_t *)((long)buf + ((len / 0x28) * 5 + -5) * 8);
    }
    len = len % 0x28;
    uVar16 = uVar16 ^ *(ulong *)buf;
    iVar9 = 8;
    do {
      uVar16 = (ulong)crc_table[uVar16 & 0xff] ^ uVar16 >> 8;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    uVar16 = uVar16 & 0xffffffff ^ uVar18 ^ *(ulong *)((long)buf + 8);
    iVar9 = 8;
    do {
      uVar16 = (ulong)crc_table[uVar16 & 0xff] ^ uVar16 >> 8;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    uVar16 = uVar16 & 0xffffffff ^ uVar13 ^ *(ulong *)((long)buf + 0x10);
    iVar9 = 8;
    do {
      uVar16 = (ulong)crc_table[uVar16 & 0xff] ^ uVar16 >> 8;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    uVar16 = uVar16 & 0xffffffff ^ uVar6 ^ *(ulong *)((long)buf + 0x18);
    iVar9 = 8;
    do {
      uVar16 = (ulong)crc_table[uVar16 & 0xff] ^ uVar16 >> 8;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    uVar16 = uVar16 & 0xffffffff ^ uVar3 ^ *(ulong *)((long)buf + 0x20);
    iVar9 = 8;
    do {
      uVar16 = (ulong)crc_table[uVar16 & 0xff] ^ uVar16 >> 8;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    buf = (uint8_t *)((long)buf + 0x28);
  }
  for (; 7 < len; len = len - 8) {
    uVar12 = (uint)(uVar16 >> 8) & 0xffffff ^ crc_table[(byte)((byte)*(ulong *)buf ^ (byte)uVar16)];
    uVar12 = uVar12 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 1) ^ (byte)uVar12)];
    uVar12 = uVar12 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 2) ^ (byte)uVar12)];
    uVar12 = uVar12 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 3) ^ (byte)uVar12)];
    uVar12 = uVar12 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 4) ^ (byte)uVar12)];
    uVar12 = uVar12 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 5) ^ (byte)uVar12)];
    uVar12 = uVar12 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 6) ^ (byte)uVar12)];
    pbVar1 = (byte *)((long)buf + 7);
    buf = (uint8_t *)((long)buf + 8);
    uVar16 = (ulong)(uVar12 >> 8 ^ crc_table[(byte)(*pbVar1 ^ (byte)uVar12)]);
  }
  uVar12 = (uint)uVar16;
  if (len != 0) {
    uVar3 = 0;
    do {
      uVar12 = (uint)(uVar16 >> 8) & 0xffffff ^
               crc_table[(byte)(*(byte *)((long)buf + uVar3) ^ (byte)uVar16)];
      uVar16 = (ulong)uVar12;
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
  }
  return ~uVar12;
}

Assistant:

Z_INTERNAL uint32_t PREFIX(crc32_braid)(uint32_t crc, const uint8_t *buf, size_t len) {
    uint32_t c;

    /* Pre-condition the CRC */
    c = (~crc) & 0xffffffff;

#ifdef W
    /* If provided enough bytes, do a braided CRC calculation. */
    if (len >= N * W + W - 1) {
        size_t blks;
        z_word_t const *words;
        int k;

        /* Compute the CRC up to a z_word_t boundary. */
        while (len && ((uintptr_t)buf & (W - 1)) != 0) {
            len--;
            DO1;
        }

        /* Compute the CRC on as many N z_word_t blocks as are available. */
        blks = len / (N * W);
        len -= blks * N * W;
        words = (z_word_t const *)buf;

        z_word_t crc0, word0, comb;
#if N > 1
        z_word_t crc1, word1;
#if N > 2
        z_word_t crc2, word2;
#if N > 3
        z_word_t crc3, word3;
#if N > 4
        z_word_t crc4, word4;
#if N > 5
        z_word_t crc5, word5;
#endif
#endif
#endif
#endif
#endif
        /* Initialize the CRC for each braid. */
        crc0 = ZSWAPWORD(c);
#if N > 1
        crc1 = 0;
#if N > 2
        crc2 = 0;
#if N > 3
        crc3 = 0;
#if N > 4
        crc4 = 0;
#if N > 5
        crc5 = 0;
#endif
#endif
#endif
#endif
#endif
        /* Process the first blks-1 blocks, computing the CRCs on each braid independently. */
        while (--blks) {
            /* Load the word for each braid into registers. */
            word0 = crc0 ^ words[0];
#if N > 1
            word1 = crc1 ^ words[1];
#if N > 2
            word2 = crc2 ^ words[2];
#if N > 3
            word3 = crc3 ^ words[3];
#if N > 4
            word4 = crc4 ^ words[4];
#if N > 5
            word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
            words += N;

            /* Compute and update the CRC for each word. The loop should get unrolled. */
            crc0 = BRAID_TABLE[0][word0 & 0xff];
#if N > 1
            crc1 = BRAID_TABLE[0][word1 & 0xff];
#if N > 2
            crc2 = BRAID_TABLE[0][word2 & 0xff];
#if N > 3
            crc3 = BRAID_TABLE[0][word3 & 0xff];
#if N > 4
            crc4 = BRAID_TABLE[0][word4 & 0xff];
#if N > 5
            crc5 = BRAID_TABLE[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
            for (k = 1; k < W; k++) {
                crc0 ^= BRAID_TABLE[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                crc1 ^= BRAID_TABLE[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                crc2 ^= BRAID_TABLE[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                crc3 ^= BRAID_TABLE[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                crc4 ^= BRAID_TABLE[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                crc5 ^= BRAID_TABLE[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
            }
        }

        /* Process the last block, combining the CRCs of the N braids at the same time. */
        comb = crc_word(crc0 ^ words[0]);
#if N > 1
        comb = crc_word(crc1 ^ words[1] ^ comb);
#if N > 2
        comb = crc_word(crc2 ^ words[2] ^ comb);
#if N > 3
        comb = crc_word(crc3 ^ words[3] ^ comb);
#if N > 4
        comb = crc_word(crc4 ^ words[4] ^ comb);
#if N > 5
        comb = crc_word(crc5 ^ words[5] ^ comb);
#endif
#endif
#endif
#endif
#endif
        words += N;
        Assert(comb <= UINT32_MAX, "comb should fit in uint32_t");
        c = (uint32_t)ZSWAPWORD(comb);

        /* Update the pointer to the remaining bytes to process. */
        buf = (const unsigned char *)words;
    }

#endif /* W */

    /* Complete the computation of the CRC on any remaining bytes. */
    while (len >= 8) {
        len -= 8;
        DO8;
    }
    while (len) {
        len--;
        DO1;
    }

    /* Return the CRC, post-conditioned. */
    return c ^ 0xffffffff;
}